

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_file_writer.cpp
# Opt level: O3

void __thiscall
duckdb::BufferedFileWriter::BufferedFileWriter
          (BufferedFileWriter *this,FileSystem *fs,string *path_p,FileOpenFlags open_flags)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var3;
  FileHandle *in_RAX;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  ulong uVar5;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_38;
  
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_01967758;
  this->fs = fs;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar1 = (path_p->_M_dataplus)._M_p;
  local_38._M_head_impl = in_RAX;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar1,pcVar1 + path_p->_M_string_length);
  _Var4._M_head_impl = (uchar *)operator_new__(0x1000);
  (this->data).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var4._M_head_impl;
  this->offset = 0;
  this->total_written = 0;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  uVar5 = 2;
  if (((undefined1  [16])open_flags & (undefined1  [16])0xff) != (undefined1  [16])0x0) {
    uVar5 = open_flags._8_8_ & 0xff;
  }
  (*fs->_vptr_FileSystem[2])
            (&local_38,fs,&this->path,open_flags.flags,uVar5 | open_flags._8_4_ & 0xff00,0);
  _Var3._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (FileHandle *)0x0;
  _Var2._M_head_impl =
       (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (FileHandle *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_FileHandle + 8))();
    if (local_38._M_head_impl != (FileHandle *)0x0) {
      (*(local_38._M_head_impl)->_vptr_FileHandle[1])();
    }
  }
  return;
}

Assistant:

BufferedFileWriter::BufferedFileWriter(FileSystem &fs, const string &path_p, FileOpenFlags open_flags)
    : fs(fs), path(path_p), data(make_unsafe_uniq_array_uninitialized<data_t>(FILE_BUFFER_SIZE)), offset(0),
      total_written(0) {
	handle = fs.OpenFile(path, open_flags | FileLockType::WRITE_LOCK);
}